

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableView::rowMoved(QTableView *this,int row,int oldIndex,int newIndex)

{
  bool bVar1;
  QTableViewPrivate *pQVar2;
  int *piVar3;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  int height;
  int bottom;
  int top;
  int logicalNewIndex;
  int logicalOldIndex;
  QTableViewPrivate *d;
  int newBottom;
  int oldBottom;
  int newTop;
  int oldTop;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  int iVar4;
  int in_stack_ffffffffffffff94;
  int iVar5;
  QHeaderView *in_stack_ffffffffffffff98;
  QWidget *pQVar6;
  int in_stack_ffffffffffffffa0;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QTableView *)0x8b6976);
  (**(code **)(*(long *)in_RDI + 0x268))();
  QHeaderView::logicalIndex(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  QHeaderView::logicalIndex(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  bVar1 = QTableViewPrivate::hasSpans((QTableViewPrivate *)0x8b69c5);
  if (bVar1) {
    QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
  else {
    local_c = rowViewportPosition((QTableView *)
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                  in_stack_ffffffffffffff8c);
    local_10 = rowViewportPosition((QTableView *)
                                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                   in_stack_ffffffffffffff8c);
    iVar4 = local_c;
    local_14 = rowHeight((QTableView *)CONCAT44(in_stack_ffffffffffffff94,local_c),
                         in_stack_ffffffffffffff8c);
    local_14 = iVar4 + local_14;
    iVar5 = local_10;
    local_18 = rowHeight((QTableView *)CONCAT44(local_10,iVar4),in_stack_ffffffffffffff8c);
    local_18 = iVar5 + local_18;
    piVar3 = qMin<int>(&local_c,&local_10);
    iVar4 = *piVar3;
    qMax<int>(&local_14,&local_18);
    pQVar6 = (pQVar2->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport;
    QWidget::width((QWidget *)0x8b6aa9);
    QWidget::update(in_RDI,iVar4,in_stack_ffffffffffffffa0,(int)((ulong)pQVar6 >> 0x20),(int)pQVar6)
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableView::rowMoved(int row, int oldIndex, int newIndex)
{
    Q_UNUSED(row);
    Q_D(QTableView);

    updateGeometries();
    int logicalOldIndex = d->verticalHeader->logicalIndex(oldIndex);
    int logicalNewIndex = d->verticalHeader->logicalIndex(newIndex);
    if (d->hasSpans()) {
        d->viewport->update();
    } else {
        int oldTop = rowViewportPosition(logicalOldIndex);
        int newTop = rowViewportPosition(logicalNewIndex);
        int oldBottom = oldTop + rowHeight(logicalOldIndex);
        int newBottom = newTop + rowHeight(logicalNewIndex);
        int top = qMin(oldTop, newTop);
        int bottom = qMax(oldBottom, newBottom);
        int height = bottom - top;
        d->viewport->update(0, top, d->viewport->width(), height);
    }
}